

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O1

void __thiscall
QMdi::ControllerWidget::setControlVisible
          (ControllerWidget *this,WindowStateAction action,bool visible)

{
  bool bVar1;
  uint uVar2;
  
  if (action == MinimizeAction) {
    uVar2 = 1;
  }
  else if (action == MaximizeAction) {
    uVar2 = 2;
  }
  else {
    if (action != CloseAction) {
      uVar2 = 0;
      bVar1 = true;
      goto LAB_004518a8;
    }
    uVar2 = 4;
  }
  bVar1 = false;
LAB_004518a8:
  if (!bVar1) {
    if ((visible) &&
       (((this->visibleControls).super_QFlagsStorageHelper<QStyle::SubControl,_4>.
         super_QFlagsStorage<QStyle::SubControl>.i & uVar2) == 0)) {
      uVar2 = uVar2 | (this->visibleControls).super_QFlagsStorageHelper<QStyle::SubControl,_4>.
                      super_QFlagsStorage<QStyle::SubControl>.i;
    }
    else {
      uVar2 = ~uVar2 & (this->visibleControls).super_QFlagsStorageHelper<QStyle::SubControl,_4>.
                       super_QFlagsStorage<QStyle::SubControl>.i;
    }
    (this->visibleControls).super_QFlagsStorageHelper<QStyle::SubControl,_4>.
    super_QFlagsStorage<QStyle::SubControl>.i = uVar2;
  }
  return;
}

Assistant:

void ControllerWidget::setControlVisible(QMdiSubWindowPrivate::WindowStateAction action, bool visible)
{
    QStyle::SubControl subControl = QStyle::SC_None;

    // Map action from QMdiSubWindowPrivate::WindowStateAction to QStyle::SubControl.
    if (action == QMdiSubWindowPrivate::MaximizeAction)
        subControl = QStyle::SC_MdiNormalButton;
    else if (action == QMdiSubWindowPrivate::CloseAction)
        subControl = QStyle::SC_MdiCloseButton;
    else if (action == QMdiSubWindowPrivate::MinimizeAction)
        subControl = QStyle::SC_MdiMinButton;

    if (subControl == QStyle::SC_None)
        return;

    visibleControls.setFlag(subControl, visible && !(visibleControls & subControl));
}